

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_true,_embree::avx2::SubGridIntersectorKPluecker<8,_4,_true>,_true>
     ::intersect1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,
                 RayHitK<4> *ray,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ushort uVar8;
  ushort uVar9;
  uint uVar10;
  Geometry *pGVar11;
  RTCFilterFunctionN p_Var12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  byte bVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  bool bVar56;
  bool bVar57;
  bool bVar58;
  bool bVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  int iVar67;
  uint uVar68;
  long lVar69;
  long lVar70;
  undefined4 uVar71;
  undefined1 (*pauVar72) [16];
  uint uVar73;
  ulong uVar74;
  undefined1 (*pauVar75) [16];
  ulong uVar76;
  undefined1 (*pauVar77) [16];
  long lVar78;
  ulong uVar79;
  long lVar80;
  undefined1 auVar81 [16];
  undefined1 auVar83 [32];
  undefined1 auVar82 [16];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar88 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 extraout_var [56];
  undefined1 auVar99 [16];
  float fVar97;
  float fVar104;
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar100 [32];
  undefined1 auVar98 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  float fVar115;
  undefined1 auVar110 [16];
  float fVar113;
  float fVar114;
  float fVar116;
  float fVar117;
  float fVar118;
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [64];
  undefined1 auVar134 [16];
  undefined1 auVar135 [32];
  undefined1 auVar133 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [64];
  undefined1 auVar140 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar144;
  float fVar148;
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  float fVar149;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  float fVar159;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  vfloat<8> tNear;
  vfloat<8> dist;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 (*local_2a58) [16];
  ulong local_2a50;
  undefined1 local_2a41;
  uint local_2a40;
  uint local_2a3c;
  ulong local_2a38;
  undefined8 local_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 *local_2a10;
  ulong local_2a08;
  ulong local_2a00;
  ulong local_29f8;
  ulong local_29f0;
  ulong local_29e8;
  ulong local_29e0;
  ulong local_29d8;
  long local_29d0;
  ulong local_29c8;
  ulong local_29c0;
  ulong local_29b8;
  ulong local_29b0;
  ulong local_29a8;
  ulong local_29a0;
  long local_2998;
  long local_2990;
  long local_2988;
  Scene *local_2980;
  ulong local_2978;
  RTCFilterFunctionNArguments local_2970;
  undefined8 local_2940;
  undefined8 uStack_2938;
  float fStack_2930;
  float fStack_292c;
  float fStack_2928;
  float fStack_2924;
  undefined1 local_2920 [16];
  undefined1 auStack_2910 [16];
  undefined1 local_2900 [32];
  undefined1 local_28e0 [32];
  undefined1 local_28c0 [32];
  undefined1 local_28a0 [32];
  int local_2880;
  int iStack_287c;
  int iStack_2878;
  int iStack_2874;
  int iStack_2870;
  int iStack_286c;
  int iStack_2868;
  int iStack_2864;
  undefined1 local_2860 [32];
  undefined1 local_2840 [32];
  undefined1 local_2820 [32];
  undefined1 local_2800 [32];
  undefined1 *local_27e0;
  undefined1 local_27c0 [32];
  undefined1 local_27a0 [32];
  undefined1 local_2780 [32];
  undefined1 local_2760 [32];
  undefined1 local_2740 [32];
  float local_2720 [4];
  float fStack_2710;
  float fStack_270c;
  float fStack_2708;
  undefined4 uStack_2704;
  float local_2700 [4];
  float fStack_26f0;
  float fStack_26ec;
  float fStack_26e8;
  undefined4 uStack_26e4;
  float local_26e0;
  float fStack_26dc;
  float fStack_26d8;
  float fStack_26d4;
  float fStack_26d0;
  float fStack_26cc;
  float fStack_26c8;
  float fStack_26c4;
  int local_26c0;
  int iStack_26bc;
  int iStack_26b8;
  int iStack_26b4;
  int iStack_26b0;
  int iStack_26ac;
  int iStack_26a8;
  int iStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  float fStack_2690;
  float fStack_268c;
  float fStack_2688;
  float fStack_2684;
  float local_2680;
  float fStack_267c;
  float fStack_2678;
  float fStack_2674;
  float fStack_2670;
  float fStack_266c;
  float fStack_2668;
  float fStack_2664;
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  float local_2640;
  float fStack_263c;
  float fStack_2638;
  float fStack_2634;
  float fStack_2630;
  float fStack_262c;
  float fStack_2628;
  float fStack_2624;
  undefined4 local_2620;
  undefined4 uStack_261c;
  undefined4 uStack_2618;
  undefined4 uStack_2614;
  undefined4 uStack_2610;
  undefined4 uStack_260c;
  undefined4 uStack_2608;
  undefined4 uStack_2604;
  float local_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [16];
  undefined4 local_25b0;
  undefined4 uStack_25ac;
  undefined4 uStack_25a8;
  undefined4 uStack_25a4;
  undefined8 local_25a0;
  undefined8 uStack_2598;
  undefined1 local_2590 [16];
  uint local_2580;
  uint uStack_257c;
  uint uStack_2578;
  uint uStack_2574;
  uint uStack_2570;
  uint uStack_256c;
  uint uStack_2568;
  uint uStack_2564;
  float local_2560;
  float fStack_255c;
  float fStack_2558;
  float fStack_2554;
  float fStack_2550;
  float fStack_254c;
  float fStack_2548;
  float fStack_2544;
  undefined1 local_2540 [8];
  float fStack_2538;
  float fStack_2534;
  float fStack_2530;
  float fStack_252c;
  float fStack_2528;
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  size_t local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  local_2a58 = (undefined1 (*) [16])local_2390;
  local_23a0 = root.ptr;
  uStack_2398 = 0;
  uVar71 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  local_28e0._4_4_ = uVar71;
  local_28e0._0_4_ = uVar71;
  local_28e0._8_4_ = uVar71;
  local_28e0._12_4_ = uVar71;
  local_28e0._16_4_ = uVar71;
  local_28e0._20_4_ = uVar71;
  local_28e0._24_4_ = uVar71;
  local_28e0._28_4_ = uVar71;
  auVar132 = ZEXT3264(local_28e0);
  uVar71 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_2900._4_4_ = uVar71;
  local_2900._0_4_ = uVar71;
  local_2900._8_4_ = uVar71;
  local_2900._12_4_ = uVar71;
  local_2900._16_4_ = uVar71;
  local_2900._20_4_ = uVar71;
  local_2900._24_4_ = uVar71;
  local_2900._28_4_ = uVar71;
  auVar139 = ZEXT3264(local_2900);
  local_2620 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uStack_261c = local_2620;
  uStack_2618 = local_2620;
  uStack_2614 = local_2620;
  uStack_2610 = local_2620;
  uStack_260c = local_2620;
  uStack_2608 = local_2620;
  uStack_2604 = local_2620;
  local_2660 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_2680 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_26a0 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  fVar148 = local_2660 * 0.99999964;
  local_26e0 = local_2680 * 0.99999964;
  local_2640 = local_26a0 * 0.99999964;
  fStack_263c = local_2640;
  fStack_2638 = local_2640;
  fStack_2634 = local_2640;
  fStack_2630 = local_2640;
  fStack_262c = local_2640;
  fStack_2628 = local_2640;
  fStack_2624 = local_2640;
  local_2660 = local_2660 * 1.0000004;
  fStack_265c = local_2660;
  fStack_2658 = local_2660;
  fStack_2654 = local_2660;
  fStack_2650 = local_2660;
  fStack_264c = local_2660;
  fStack_2648 = local_2660;
  fStack_2644 = local_2660;
  local_2680 = local_2680 * 1.0000004;
  fStack_267c = local_2680;
  fStack_2678 = local_2680;
  fStack_2674 = local_2680;
  fStack_2670 = local_2680;
  fStack_266c = local_2680;
  fStack_2668 = local_2680;
  fStack_2664 = local_2680;
  local_26a0 = local_26a0 * 1.0000004;
  fStack_269c = local_26a0;
  fStack_2698 = local_26a0;
  fStack_2694 = local_26a0;
  fStack_2690 = local_26a0;
  fStack_268c = local_26a0;
  fStack_2688 = local_26a0;
  fStack_2684 = local_26a0;
  local_29a0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  local_29a8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  local_29b0 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  local_29b8 = local_29a0 ^ 0x20;
  local_29c0 = local_29a8 ^ 0x20;
  local_26c0 = (tray->tnear).field_0.i[k];
  iStack_26bc = local_26c0;
  iStack_26b8 = local_26c0;
  iStack_26b4 = local_26c0;
  iStack_26b0 = local_26c0;
  iStack_26ac = local_26c0;
  iStack_26a8 = local_26c0;
  iStack_26a4 = local_26c0;
  local_29c8 = local_29b0 ^ 0x20;
  iStack_2864 = (tray->tfar).field_0.i[k];
  local_29d8 = local_29a0 >> 2;
  local_29e0 = local_29b8 >> 2;
  local_2520._16_16_ = mm_lookupmask_ps._240_16_;
  local_2520._0_16_ = mm_lookupmask_ps._0_16_;
  local_2a10 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_29e8 = local_29a8 >> 2;
  local_29f0 = local_29c0 >> 2;
  local_29f8 = local_29b0 >> 2;
  local_2a00 = local_29c8 >> 2;
  auVar100._8_4_ = 0x3f800000;
  auVar100._0_8_ = &DAT_3f8000003f800000;
  auVar100._12_4_ = 0x3f800000;
  auVar100._16_4_ = 0x3f800000;
  auVar100._20_4_ = 0x3f800000;
  auVar100._24_4_ = 0x3f800000;
  auVar100._28_4_ = 0x3f800000;
  auVar83._8_4_ = 0xbf800000;
  auVar83._0_8_ = 0xbf800000bf800000;
  auVar83._12_4_ = 0xbf800000;
  auVar83._16_4_ = 0xbf800000;
  auVar83._20_4_ = 0xbf800000;
  auVar83._24_4_ = 0xbf800000;
  auVar83._28_4_ = 0xbf800000;
  _local_2540 = vblendvps_avx(auVar100,auVar83,local_2520);
  local_2560 = fVar148;
  fStack_255c = fVar148;
  fStack_2558 = fVar148;
  fStack_2554 = fVar148;
  fStack_2550 = fVar148;
  fStack_254c = fVar148;
  fStack_2548 = fVar148;
  fStack_2544 = fVar148;
  fStack_26dc = local_26e0;
  fStack_26d8 = local_26e0;
  fStack_26d4 = local_26e0;
  fStack_26d0 = local_26e0;
  fStack_26cc = local_26e0;
  fStack_26c8 = local_26e0;
  fStack_26c4 = local_26e0;
  iStack_2868 = iStack_2864;
  iStack_286c = iStack_2864;
  iStack_2870 = iStack_2864;
  iStack_2874 = iStack_2864;
  iStack_2878 = iStack_2864;
  iStack_287c = iStack_2864;
  local_2880 = iStack_2864;
  fVar107 = fVar148;
  fVar106 = fVar148;
  fVar105 = fVar148;
  fVar104 = fVar148;
  fVar97 = fVar148;
  fVar144 = fVar148;
  fVar108 = local_26e0;
  fVar109 = local_26e0;
  fVar159 = local_26e0;
  fVar113 = local_26e0;
  fVar114 = local_26e0;
  fVar115 = local_26e0;
  fVar116 = local_26e0;
  do {
    do {
      if (local_2a58 == (undefined1 (*) [16])&local_23a0) {
        return;
      }
      pauVar72 = local_2a58 + -1;
      local_2a58 = local_2a58 + -1;
    } while (*(float *)(ray + k * 4 + 0x80) < *(float *)(*pauVar72 + 8));
    local_2a50 = *(ulong *)*local_2a58;
    do {
      if ((local_2a50 & 8) == 0) {
        auVar83 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29a0),auVar132._0_32_)
        ;
        auVar124._4_4_ = fVar97 * auVar83._4_4_;
        auVar124._0_4_ = fVar144 * auVar83._0_4_;
        auVar124._8_4_ = fVar104 * auVar83._8_4_;
        auVar124._12_4_ = fVar105 * auVar83._12_4_;
        auVar124._16_4_ = fVar106 * auVar83._16_4_;
        auVar124._20_4_ = fVar107 * auVar83._20_4_;
        auVar124._24_4_ = fVar148 * auVar83._24_4_;
        auVar124._28_4_ = auVar83._28_4_;
        auVar83 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29a8),auVar139._0_32_)
        ;
        auVar20._4_4_ = fVar115 * auVar83._4_4_;
        auVar20._0_4_ = fVar116 * auVar83._0_4_;
        auVar20._8_4_ = fVar114 * auVar83._8_4_;
        auVar20._12_4_ = fVar113 * auVar83._12_4_;
        auVar20._16_4_ = fVar159 * auVar83._16_4_;
        auVar20._20_4_ = fVar109 * auVar83._20_4_;
        auVar20._24_4_ = fVar108 * auVar83._24_4_;
        auVar20._28_4_ = auVar83._28_4_;
        auVar83 = vmaxps_avx(auVar124,auVar20);
        auVar65._4_4_ = uStack_261c;
        auVar65._0_4_ = local_2620;
        auVar65._8_4_ = uStack_2618;
        auVar65._12_4_ = uStack_2614;
        auVar65._16_4_ = uStack_2610;
        auVar65._20_4_ = uStack_260c;
        auVar65._24_4_ = uStack_2608;
        auVar65._28_4_ = uStack_2604;
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29b0),auVar65);
        auVar21._4_4_ = auVar100._4_4_ * fStack_263c;
        auVar21._0_4_ = auVar100._0_4_ * local_2640;
        auVar21._8_4_ = auVar100._8_4_ * fStack_2638;
        auVar21._12_4_ = auVar100._12_4_ * fStack_2634;
        auVar21._16_4_ = auVar100._16_4_ * fStack_2630;
        auVar21._20_4_ = auVar100._20_4_ * fStack_262c;
        auVar21._24_4_ = auVar100._24_4_ * fStack_2628;
        auVar21._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29b8),auVar132._0_32_
                             );
        auVar22._4_4_ = auVar100._4_4_ * fStack_265c;
        auVar22._0_4_ = auVar100._0_4_ * local_2660;
        auVar22._8_4_ = auVar100._8_4_ * fStack_2658;
        auVar22._12_4_ = auVar100._12_4_ * fStack_2654;
        auVar22._16_4_ = auVar100._16_4_ * fStack_2650;
        auVar22._20_4_ = auVar100._20_4_ * fStack_264c;
        auVar22._24_4_ = auVar100._24_4_ * fStack_2648;
        auVar22._28_4_ = auVar100._28_4_;
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29c0),auVar139._0_32_
                             );
        auVar23._4_4_ = auVar100._4_4_ * fStack_267c;
        auVar23._0_4_ = auVar100._0_4_ * local_2680;
        auVar23._8_4_ = auVar100._8_4_ * fStack_2678;
        auVar23._12_4_ = auVar100._12_4_ * fStack_2674;
        auVar23._16_4_ = auVar100._16_4_ * fStack_2670;
        auVar23._20_4_ = auVar100._20_4_ * fStack_266c;
        auVar23._24_4_ = auVar100._24_4_ * fStack_2668;
        auVar23._28_4_ = auVar100._28_4_;
        auVar124 = vminps_avx(auVar22,auVar23);
        auVar100 = vsubps_avx(*(undefined1 (*) [32])(local_2a50 + 0x40 + local_29c8),auVar65);
        auVar24._4_4_ = auVar100._4_4_ * fStack_269c;
        auVar24._0_4_ = auVar100._0_4_ * local_26a0;
        auVar24._8_4_ = auVar100._8_4_ * fStack_2698;
        auVar24._12_4_ = auVar100._12_4_ * fStack_2694;
        auVar24._16_4_ = auVar100._16_4_ * fStack_2690;
        auVar24._20_4_ = auVar100._20_4_ * fStack_268c;
        auVar24._24_4_ = auVar100._24_4_ * fStack_2688;
        auVar24._28_4_ = auVar100._28_4_;
        auVar63._4_4_ = iStack_26bc;
        auVar63._0_4_ = local_26c0;
        auVar63._8_4_ = iStack_26b8;
        auVar63._12_4_ = iStack_26b4;
        auVar63._16_4_ = iStack_26b0;
        auVar63._20_4_ = iStack_26ac;
        auVar63._24_4_ = iStack_26a8;
        auVar63._28_4_ = iStack_26a4;
        auVar100 = vmaxps_avx(auVar21,auVar63);
        local_2840 = vmaxps_avx(auVar83,auVar100);
        auVar172._4_4_ = iStack_287c;
        auVar172._0_4_ = local_2880;
        auVar172._8_4_ = iStack_2878;
        auVar172._12_4_ = iStack_2874;
        auVar172._16_4_ = iStack_2870;
        auVar172._20_4_ = iStack_286c;
        auVar172._24_4_ = iStack_2868;
        auVar172._28_4_ = iStack_2864;
        auVar83 = vminps_avx(auVar24,auVar172);
        auVar83 = vminps_avx(auVar124,auVar83);
        auVar83 = vcmpps_avx(local_2840,auVar83,2);
        uVar71 = vmovmskps_avx(auVar83);
        local_2a08 = CONCAT44((int)(local_2a50 >> 0x20),uVar71);
      }
      if ((local_2a50 & 8) == 0) {
        if (local_2a08 == 0) {
          iVar67 = 4;
        }
        else {
          uVar79 = local_2a50 & 0xfffffffffffffff0;
          lVar69 = 0;
          for (uVar76 = local_2a08; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
            lVar69 = lVar69 + 1;
          }
          iVar67 = 0;
          uVar76 = local_2a08 - 1 & local_2a08;
          local_2a50 = *(ulong *)(uVar79 + lVar69 * 8);
          if (uVar76 != 0) {
            uVar10 = *(uint *)(local_2840 + lVar69 * 4);
            lVar69 = 0;
            for (uVar74 = uVar76; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
              lVar69 = lVar69 + 1;
            }
            uVar76 = uVar76 - 1 & uVar76;
            uVar74 = *(ulong *)(uVar79 + lVar69 * 8);
            uVar73 = *(uint *)(local_2840 + lVar69 * 4);
            if (uVar76 == 0) {
              if (uVar10 < uVar73) {
                *(ulong *)*local_2a58 = uVar74;
                *(uint *)(*local_2a58 + 8) = uVar73;
                local_2a58 = local_2a58 + 1;
              }
              else {
                *(ulong *)*local_2a58 = local_2a50;
                *(uint *)(*local_2a58 + 8) = uVar10;
                local_2a58 = local_2a58 + 1;
                local_2a50 = uVar74;
              }
            }
            else {
              auVar81._8_8_ = 0;
              auVar81._0_8_ = local_2a50;
              auVar81 = vpunpcklqdq_avx(auVar81,ZEXT416(uVar10));
              auVar88._8_8_ = 0;
              auVar88._0_8_ = uVar74;
              auVar88 = vpunpcklqdq_avx(auVar88,ZEXT416(uVar73));
              lVar69 = 0;
              for (uVar74 = uVar76; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                lVar69 = lVar69 + 1;
              }
              uVar76 = uVar76 - 1 & uVar76;
              auVar98._8_8_ = 0;
              auVar98._0_8_ = *(ulong *)(uVar79 + lVar69 * 8);
              auVar82 = vpunpcklqdq_avx(auVar98,ZEXT416(*(uint *)(local_2840 + lVar69 * 4)));
              auVar98 = vpcmpgtd_avx(auVar88,auVar81);
              if (uVar76 == 0) {
                auVar119 = vpshufd_avx(auVar98,0xaa);
                auVar98 = vblendvps_avx(auVar88,auVar81,auVar119);
                auVar81 = vblendvps_avx(auVar81,auVar88,auVar119);
                auVar88 = vpcmpgtd_avx(auVar82,auVar98);
                auVar119 = vpshufd_avx(auVar88,0xaa);
                auVar88 = vblendvps_avx(auVar82,auVar98,auVar119);
                auVar98 = vblendvps_avx(auVar98,auVar82,auVar119);
                auVar82 = vpcmpgtd_avx(auVar98,auVar81);
                auVar119 = vpshufd_avx(auVar82,0xaa);
                auVar82 = vblendvps_avx(auVar98,auVar81,auVar119);
                auVar81 = vblendvps_avx(auVar81,auVar98,auVar119);
                *local_2a58 = auVar81;
                local_2a58[1] = auVar82;
                local_2a50 = vmovlps_avx(auVar88);
                local_2a58 = local_2a58 + 2;
              }
              else {
                lVar69 = 0;
                for (uVar74 = uVar76; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x8000000000000000)
                {
                  lVar69 = lVar69 + 1;
                }
                uVar76 = uVar76 - 1 & uVar76;
                auVar119._8_8_ = 0;
                auVar119._0_8_ = *(ulong *)(uVar79 + lVar69 * 8);
                auVar119 = vpunpcklqdq_avx(auVar119,ZEXT416(*(uint *)(local_2840 + lVar69 * 4)));
                if (uVar76 == 0) {
                  auVar2 = vpshufd_avx(auVar98,0xaa);
                  auVar98 = vblendvps_avx(auVar88,auVar81,auVar2);
                  auVar81 = vblendvps_avx(auVar81,auVar88,auVar2);
                  auVar88 = vpcmpgtd_avx(auVar119,auVar82);
                  auVar2 = vpshufd_avx(auVar88,0xaa);
                  auVar88 = vblendvps_avx(auVar119,auVar82,auVar2);
                  auVar82 = vblendvps_avx(auVar82,auVar119,auVar2);
                  auVar119 = vpcmpgtd_avx(auVar82,auVar81);
                  auVar2 = vpshufd_avx(auVar119,0xaa);
                  auVar119 = vblendvps_avx(auVar82,auVar81,auVar2);
                  auVar81 = vblendvps_avx(auVar81,auVar82,auVar2);
                  auVar82 = vpcmpgtd_avx(auVar88,auVar98);
                  auVar2 = vpshufd_avx(auVar82,0xaa);
                  auVar82 = vblendvps_avx(auVar88,auVar98,auVar2);
                  auVar88 = vblendvps_avx(auVar98,auVar88,auVar2);
                  auVar98 = vpcmpgtd_avx(auVar119,auVar88);
                  auVar2 = vpshufd_avx(auVar98,0xaa);
                  auVar98 = vblendvps_avx(auVar119,auVar88,auVar2);
                  auVar88 = vblendvps_avx(auVar88,auVar119,auVar2);
                  *local_2a58 = auVar81;
                  local_2a58[1] = auVar88;
                  local_2a58[2] = auVar98;
                  local_2a50 = vmovlps_avx(auVar82);
                  pauVar72 = local_2a58 + 3;
                }
                else {
                  *local_2a58 = auVar81;
                  local_2a58[1] = auVar88;
                  local_2a58[2] = auVar82;
                  local_2a58[3] = auVar119;
                  lVar69 = 0x30;
                  do {
                    lVar70 = lVar69;
                    lVar69 = 0;
                    for (uVar74 = uVar76; (uVar74 & 1) == 0;
                        uVar74 = uVar74 >> 1 | 0x8000000000000000) {
                      lVar69 = lVar69 + 1;
                    }
                    auVar82._8_8_ = 0;
                    auVar82._0_8_ = *(ulong *)(uVar79 + lVar69 * 8);
                    auVar81 = vpunpcklqdq_avx(auVar82,ZEXT416(*(uint *)(local_2840 + lVar69 * 4)));
                    *(undefined1 (*) [16])(local_2a58[1] + lVar70) = auVar81;
                    uVar76 = uVar76 - 1 & uVar76;
                    lVar69 = lVar70 + 0x10;
                  } while (uVar76 != 0);
                  pauVar72 = (undefined1 (*) [16])(local_2a58[1] + lVar70);
                  if (lVar70 + 0x10 != 0) {
                    lVar69 = 0x10;
                    pauVar75 = local_2a58;
                    do {
                      auVar81 = pauVar75[1];
                      uVar10 = *(uint *)(pauVar75[1] + 8);
                      pauVar75 = pauVar75 + 1;
                      lVar70 = lVar69;
                      do {
                        if (uVar10 <= *(uint *)(local_2a58[-1] + lVar70 + 8)) {
                          pauVar77 = (undefined1 (*) [16])(*local_2a58 + lVar70);
                          break;
                        }
                        *(undefined1 (*) [16])(*local_2a58 + lVar70) =
                             *(undefined1 (*) [16])(local_2a58[-1] + lVar70);
                        lVar70 = lVar70 + -0x10;
                        pauVar77 = local_2a58;
                      } while (lVar70 != 0);
                      *pauVar77 = auVar81;
                      lVar69 = lVar69 + 0x10;
                    } while (pauVar72 != pauVar75);
                  }
                  local_2a50 = *(ulong *)*pauVar72;
                }
                auVar132 = ZEXT3264(local_28e0);
                auVar139 = ZEXT3264(local_2900);
                local_2a58 = pauVar72;
              }
            }
          }
        }
      }
      else {
        iVar67 = 6;
      }
    } while (iVar67 == 0);
    if (iVar67 == 6) {
      local_29d0 = (ulong)((uint)local_2a50 & 0xf) - 8;
      if (local_29d0 != 0) {
        local_2a50 = local_2a50 & 0xfffffffffffffff0;
        local_2998 = 0;
        do {
          lVar69 = local_2998 * 0x90;
          uVar71 = *(undefined4 *)(local_2a50 + 0x70 + lVar69);
          auVar101._4_4_ = uVar71;
          auVar101._0_4_ = uVar71;
          auVar101._8_4_ = uVar71;
          auVar101._12_4_ = uVar71;
          auVar101._16_4_ = uVar71;
          auVar101._20_4_ = uVar71;
          auVar101._24_4_ = uVar71;
          auVar101._28_4_ = uVar71;
          uVar71 = *(undefined4 *)(local_2a50 + 0x7c + lVar69);
          auVar111._4_4_ = uVar71;
          auVar111._0_4_ = uVar71;
          auVar111._8_4_ = uVar71;
          auVar111._12_4_ = uVar71;
          auVar111._16_4_ = uVar71;
          auVar111._20_4_ = uVar71;
          auVar111._24_4_ = uVar71;
          auVar111._28_4_ = uVar71;
          local_2990 = local_2a50 + lVar69;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)(local_29d8 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar2);
          auVar83 = vcvtdq2ps_avx(auVar83);
          auVar98 = vfmadd213ps_fma(auVar83,auVar111,auVar101);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_29e0 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar3);
          auVar83 = vcvtdq2ps_avx(auVar83);
          uVar71 = *(undefined4 *)(local_2a50 + 0x74 + lVar69);
          auVar120._4_4_ = uVar71;
          auVar120._0_4_ = uVar71;
          auVar120._8_4_ = uVar71;
          auVar120._12_4_ = uVar71;
          auVar120._16_4_ = uVar71;
          auVar120._20_4_ = uVar71;
          auVar120._24_4_ = uVar71;
          auVar120._28_4_ = uVar71;
          uVar71 = *(undefined4 *)(local_2a50 + 0x80 + lVar69);
          auVar126._4_4_ = uVar71;
          auVar126._0_4_ = uVar71;
          auVar126._8_4_ = uVar71;
          auVar126._12_4_ = uVar71;
          auVar126._16_4_ = uVar71;
          auVar126._20_4_ = uVar71;
          auVar126._24_4_ = uVar71;
          auVar126._28_4_ = uVar71;
          auVar82 = vfmadd213ps_fma(auVar83,auVar111,auVar101);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_29e8 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar4);
          auVar83 = vcvtdq2ps_avx(auVar83);
          auVar119 = vfmadd213ps_fma(auVar83,auVar126,auVar120);
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_29f0 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar5);
          auVar83 = vcvtdq2ps_avx(auVar83);
          uVar71 = *(undefined4 *)(local_2a50 + 0x78 + lVar69);
          auVar135._4_4_ = uVar71;
          auVar135._0_4_ = uVar71;
          auVar135._8_4_ = uVar71;
          auVar135._12_4_ = uVar71;
          auVar135._16_4_ = uVar71;
          auVar135._20_4_ = uVar71;
          auVar135._24_4_ = uVar71;
          auVar135._28_4_ = uVar71;
          uVar71 = *(undefined4 *)(local_2a50 + 0x84 + lVar69);
          auVar141._4_4_ = uVar71;
          auVar141._0_4_ = uVar71;
          auVar141._8_4_ = uVar71;
          auVar141._12_4_ = uVar71;
          auVar141._16_4_ = uVar71;
          auVar141._20_4_ = uVar71;
          auVar141._24_4_ = uVar71;
          auVar141._28_4_ = uVar71;
          auVar2 = vfmadd213ps_fma(auVar83,auVar126,auVar120);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_29f8 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar6);
          auVar83 = vcvtdq2ps_avx(auVar83);
          auVar3 = vfmadd213ps_fma(auVar83,auVar141,auVar135);
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_2a00 + 0x40 + local_2990);
          auVar83 = vpmovzxbd_avx2(auVar7);
          auVar83 = vcvtdq2ps_avx(auVar83);
          auVar4 = vfmadd213ps_fma(auVar83,auVar141,auVar135);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = *(ulong *)(local_2a50 + 0x40 + lVar69);
          auVar140._8_8_ = 0;
          auVar140._0_8_ = *(ulong *)(local_2a50 + 0x48 + lVar69);
          auVar81 = vpminub_avx(auVar133,auVar140);
          auVar88 = vpcmpeqb_avx(auVar133,auVar81);
          auVar83 = vsubps_avx(ZEXT1632(auVar98),local_28e0);
          auVar26._4_4_ = fVar97 * auVar83._4_4_;
          auVar26._0_4_ = fVar144 * auVar83._0_4_;
          auVar26._8_4_ = fVar104 * auVar83._8_4_;
          auVar26._12_4_ = fVar105 * auVar83._12_4_;
          auVar26._16_4_ = fVar106 * auVar83._16_4_;
          auVar26._20_4_ = fVar107 * auVar83._20_4_;
          auVar26._24_4_ = fVar148 * auVar83._24_4_;
          auVar26._28_4_ = auVar83._28_4_;
          auVar83 = vsubps_avx(ZEXT1632(auVar119),local_2900);
          auVar27._4_4_ = auVar83._4_4_ * fStack_26dc;
          auVar27._0_4_ = auVar83._0_4_ * local_26e0;
          auVar27._8_4_ = auVar83._8_4_ * fStack_26d8;
          auVar27._12_4_ = auVar83._12_4_ * fStack_26d4;
          auVar27._16_4_ = auVar83._16_4_ * fStack_26d0;
          auVar27._20_4_ = auVar83._20_4_ * fStack_26cc;
          auVar27._24_4_ = auVar83._24_4_ * fStack_26c8;
          auVar27._28_4_ = auVar83._28_4_;
          auVar83 = vmaxps_avx(auVar26,auVar27);
          auVar100 = vsubps_avx(ZEXT1632(auVar82),local_28e0);
          auVar28._4_4_ = auVar100._4_4_ * fStack_265c;
          auVar28._0_4_ = auVar100._0_4_ * local_2660;
          auVar28._8_4_ = auVar100._8_4_ * fStack_2658;
          auVar28._12_4_ = auVar100._12_4_ * fStack_2654;
          auVar28._16_4_ = auVar100._16_4_ * fStack_2650;
          auVar28._20_4_ = auVar100._20_4_ * fStack_264c;
          auVar28._24_4_ = auVar100._24_4_ * fStack_2648;
          auVar28._28_4_ = auVar100._28_4_;
          auVar100 = vsubps_avx(ZEXT1632(auVar2),local_2900);
          auVar29._4_4_ = auVar100._4_4_ * fStack_267c;
          auVar29._0_4_ = auVar100._0_4_ * local_2680;
          auVar29._8_4_ = auVar100._8_4_ * fStack_2678;
          auVar29._12_4_ = auVar100._12_4_ * fStack_2674;
          auVar29._16_4_ = auVar100._16_4_ * fStack_2670;
          auVar29._20_4_ = auVar100._20_4_ * fStack_266c;
          auVar29._24_4_ = auVar100._24_4_ * fStack_2668;
          auVar29._28_4_ = auVar100._28_4_;
          auVar124 = vminps_avx(auVar28,auVar29);
          auVar66._4_4_ = uStack_261c;
          auVar66._0_4_ = local_2620;
          auVar66._8_4_ = uStack_2618;
          auVar66._12_4_ = uStack_2614;
          auVar66._16_4_ = uStack_2610;
          auVar66._20_4_ = uStack_260c;
          auVar66._24_4_ = uStack_2608;
          auVar66._28_4_ = uStack_2604;
          auVar100 = vsubps_avx(ZEXT1632(auVar3),auVar66);
          auVar30._4_4_ = auVar100._4_4_ * fStack_263c;
          auVar30._0_4_ = auVar100._0_4_ * local_2640;
          auVar30._8_4_ = auVar100._8_4_ * fStack_2638;
          auVar30._12_4_ = auVar100._12_4_ * fStack_2634;
          auVar30._16_4_ = auVar100._16_4_ * fStack_2630;
          auVar30._20_4_ = auVar100._20_4_ * fStack_262c;
          auVar30._24_4_ = auVar100._24_4_ * fStack_2628;
          auVar30._28_4_ = auVar100._28_4_;
          auVar64._4_4_ = iStack_26bc;
          auVar64._0_4_ = local_26c0;
          auVar64._8_4_ = iStack_26b8;
          auVar64._12_4_ = iStack_26b4;
          auVar64._16_4_ = iStack_26b0;
          auVar64._20_4_ = iStack_26ac;
          auVar64._24_4_ = iStack_26a8;
          auVar64._28_4_ = iStack_26a4;
          auVar100 = vmaxps_avx(auVar30,auVar64);
          local_23c0 = vmaxps_avx(auVar83,auVar100);
          auVar83 = vsubps_avx(ZEXT1632(auVar4),auVar66);
          auVar31._4_4_ = auVar83._4_4_ * fStack_269c;
          auVar31._0_4_ = auVar83._0_4_ * local_26a0;
          auVar31._8_4_ = auVar83._8_4_ * fStack_2698;
          auVar31._12_4_ = auVar83._12_4_ * fStack_2694;
          auVar31._16_4_ = auVar83._16_4_ * fStack_2690;
          auVar31._20_4_ = auVar83._20_4_ * fStack_268c;
          auVar31._24_4_ = auVar83._24_4_ * fStack_2688;
          auVar31._28_4_ = auVar83._28_4_;
          auVar62._4_4_ = iStack_287c;
          auVar62._0_4_ = local_2880;
          auVar62._8_4_ = iStack_2878;
          auVar62._12_4_ = iStack_2874;
          auVar62._16_4_ = iStack_2870;
          auVar62._20_4_ = iStack_286c;
          auVar62._24_4_ = iStack_2868;
          auVar62._28_4_ = iStack_2864;
          auVar83 = vminps_avx(auVar31,auVar62);
          auVar83 = vminps_avx(auVar124,auVar83);
          auVar83 = vcmpps_avx(local_23c0,auVar83,2);
          auVar81 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
          auVar88 = vpmovzxbw_avx(auVar88);
          auVar81 = vpand_avx(auVar81,auVar88);
          auVar81 = vpshufb_avx(auVar81,_DAT_0205e3c0);
          bVar25 = SUB161(auVar81 >> 7,0) & 1 | (SUB161(auVar81 >> 0xf,0) & 1) << 1 |
                   (SUB161(auVar81 >> 0x17,0) & 1) << 2 | (SUB161(auVar81 >> 0x1f,0) & 1) << 3 |
                   (SUB161(auVar81 >> 0x27,0) & 1) << 4 | (SUB161(auVar81 >> 0x2f,0) & 1) << 5 |
                   (SUB161(auVar81 >> 0x37,0) & 1) << 6 | SUB161(auVar81 >> 0x3f,0) << 7;
          if (bVar25 != 0) {
            local_2978 = (ulong)bVar25;
            do {
              lVar69 = 0;
              for (uVar76 = local_2978; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000
                  ) {
                lVar69 = lVar69 + 1;
              }
              fVar148 = *(float *)(ray + k * 4 + 0x80);
              if (*(float *)(local_23c0 + lVar69 * 4) <= fVar148) {
                uVar8 = *(ushort *)(local_2990 + lVar69 * 8);
                uVar9 = *(ushort *)(local_2990 + 2 + lVar69 * 8);
                local_2920._4_4_ = *(uint *)(local_2990 + 0x88);
                uVar10 = *(uint *)(local_2990 + 4 + lVar69 * 8);
                local_2a38 = (ulong)uVar10;
                local_2980 = context->scene;
                pGVar11 = (local_2980->geometries).items[(uint)local_2920._4_4_].ptr;
                local_2988 = *(long *)&pGVar11->field_0x58;
                lVar78 = pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                         _M_i * local_2a38;
                local_2a3c = uVar8 & 0x7fff;
                local_2a40 = uVar9 & 0x7fff;
                uVar73 = *(uint *)(local_2988 + 4 + lVar78);
                uVar74 = (ulong)uVar73;
                uVar79 = (ulong)(uVar73 * local_2a40 + *(int *)(local_2988 + lVar78) + local_2a3c);
                lVar69 = *(long *)&pGVar11[1].time_range.upper;
                p_Var12 = pGVar11[1].intersectionFilterN;
                auVar81 = *(undefined1 (*) [16])(lVar69 + (uVar79 + 1) * (long)p_Var12);
                auVar88 = *(undefined1 (*) [16])(lVar69 + (uVar79 + uVar74) * (long)p_Var12);
                lVar70 = uVar79 + uVar74 + 1;
                auVar98 = *(undefined1 (*) [16])(lVar69 + lVar70 * (long)p_Var12);
                auVar82 = *(undefined1 (*) [16])
                           (lVar69 + (uVar79 + (-1 < (short)uVar8) + 1) * (long)p_Var12);
                lVar80 = (ulong)(-1 < (short)uVar8) + lVar70;
                auVar119 = *(undefined1 (*) [16])(lVar69 + lVar80 * (long)p_Var12);
                uVar76 = 0;
                if (-1 < (short)uVar9) {
                  uVar76 = uVar74;
                }
                auVar2 = *(undefined1 (*) [16])(lVar69 + (uVar79 + uVar74 + uVar76) * (long)p_Var12)
                ;
                auVar3 = *(undefined1 (*) [16])(lVar69 + (lVar70 + uVar76) * (long)p_Var12);
                auVar145._16_16_ =
                     *(undefined1 (*) [16])(lVar69 + (uVar76 + lVar80) * (long)p_Var12);
                auVar145._0_16_ = auVar98;
                auVar5 = vunpcklps_avx(auVar81,auVar119);
                auVar4 = vunpckhps_avx(auVar81,auVar119);
                auVar6 = vunpcklps_avx(auVar82,auVar98);
                auVar82 = vunpckhps_avx(auVar82,auVar98);
                auVar7 = vunpcklps_avx(auVar4,auVar82);
                auVar133 = vunpcklps_avx(auVar5,auVar6);
                auVar82 = vunpckhps_avx(auVar5,auVar6);
                auVar5 = vunpcklps_avx(auVar88,auVar3);
                auVar4 = vunpckhps_avx(auVar88,auVar3);
                auVar6 = vunpcklps_avx(auVar98,auVar2);
                auVar2 = vunpckhps_avx(auVar98,auVar2);
                auVar4 = vunpcklps_avx(auVar4,auVar2);
                auVar140 = vunpcklps_avx(auVar5,auVar6);
                auVar2 = vunpckhps_avx(auVar5,auVar6);
                auVar102._16_16_ = auVar3;
                auVar102._0_16_ = auVar88;
                auVar92._16_16_ = auVar119;
                auVar92._0_16_ = auVar81;
                auVar83 = vunpcklps_avx(auVar92,auVar102);
                auVar84._16_16_ = auVar98;
                auVar84._0_16_ = *(undefined1 (*) [16])(lVar69 + (long)p_Var12 * uVar79);
                auVar100 = vunpcklps_avx(auVar84,auVar145);
                auVar24 = vunpcklps_avx(auVar100,auVar83);
                auVar83 = vunpckhps_avx(auVar100,auVar83);
                auVar100 = vunpckhps_avx(auVar92,auVar102);
                auVar124 = vunpckhps_avx(auVar84,auVar145);
                auVar100 = vunpcklps_avx(auVar124,auVar100);
                auVar93._16_16_ = auVar133;
                auVar93._0_16_ = auVar133;
                auVar121._16_16_ = auVar82;
                auVar121._0_16_ = auVar82;
                auVar127._16_16_ = auVar7;
                auVar127._0_16_ = auVar7;
                auVar146._16_16_ = auVar140;
                auVar146._0_16_ = auVar140;
                auVar150._16_16_ = auVar2;
                auVar150._0_16_ = auVar2;
                local_27e0 = &local_2a41;
                uVar71 = *(undefined4 *)(ray + k * 4);
                auVar160._4_4_ = uVar71;
                auVar160._0_4_ = uVar71;
                auVar160._8_4_ = uVar71;
                auVar160._12_4_ = uVar71;
                auVar160._16_4_ = uVar71;
                auVar160._20_4_ = uVar71;
                auVar160._24_4_ = uVar71;
                auVar160._28_4_ = uVar71;
                uVar71 = *(undefined4 *)(ray + k * 4 + 0x10);
                auVar169._4_4_ = uVar71;
                auVar169._0_4_ = uVar71;
                auVar169._8_4_ = uVar71;
                auVar169._12_4_ = uVar71;
                auVar169._16_4_ = uVar71;
                auVar169._20_4_ = uVar71;
                auVar169._24_4_ = uVar71;
                auVar169._28_4_ = uVar71;
                auVar136._16_16_ = auVar4;
                auVar136._0_16_ = auVar4;
                uVar71 = *(undefined4 *)(ray + k * 4 + 0x20);
                auVar170._4_4_ = uVar71;
                auVar170._0_4_ = uVar71;
                auVar170._8_4_ = uVar71;
                auVar170._12_4_ = uVar71;
                auVar170._16_4_ = uVar71;
                auVar170._20_4_ = uVar71;
                auVar170._24_4_ = uVar71;
                auVar170._28_4_ = uVar71;
                auVar20 = vsubps_avx(auVar24,auVar160);
                local_23e0 = vsubps_avx(auVar83,auVar169);
                local_2400 = vsubps_avx(auVar100,auVar170);
                auVar83 = vsubps_avx(auVar93,auVar160);
                auVar100 = vsubps_avx(auVar121,auVar169);
                auVar124 = vsubps_avx(auVar127,auVar170);
                auVar21 = vsubps_avx(auVar146,auVar160);
                auVar22 = vsubps_avx(auVar150,auVar169);
                auVar23 = vsubps_avx(auVar136,auVar170);
                local_2420 = vsubps_avx(auVar21,auVar20);
                local_2460 = vsubps_avx(auVar22,local_23e0);
                local_2440 = vsubps_avx(auVar23,local_2400);
                auVar85._0_4_ = auVar20._0_4_ + auVar21._0_4_;
                auVar85._4_4_ = auVar20._4_4_ + auVar21._4_4_;
                auVar85._8_4_ = auVar20._8_4_ + auVar21._8_4_;
                auVar85._12_4_ = auVar20._12_4_ + auVar21._12_4_;
                auVar85._16_4_ = auVar20._16_4_ + auVar21._16_4_;
                auVar85._20_4_ = auVar20._20_4_ + auVar21._20_4_;
                auVar85._24_4_ = auVar20._24_4_ + auVar21._24_4_;
                fVar164 = auVar20._28_4_;
                auVar85._28_4_ = fVar164 + auVar21._28_4_;
                auVar112._0_4_ = auVar22._0_4_ + local_23e0._0_4_;
                auVar112._4_4_ = auVar22._4_4_ + local_23e0._4_4_;
                auVar112._8_4_ = auVar22._8_4_ + local_23e0._8_4_;
                auVar112._12_4_ = auVar22._12_4_ + local_23e0._12_4_;
                auVar112._16_4_ = auVar22._16_4_ + local_23e0._16_4_;
                auVar112._20_4_ = auVar22._20_4_ + local_23e0._20_4_;
                auVar112._24_4_ = auVar22._24_4_ + local_23e0._24_4_;
                auVar112._28_4_ = auVar22._28_4_ + local_23e0._28_4_;
                fVar144 = local_2400._0_4_;
                auVar137._0_4_ = auVar23._0_4_ + fVar144;
                fVar97 = local_2400._4_4_;
                auVar137._4_4_ = auVar23._4_4_ + fVar97;
                fVar104 = local_2400._8_4_;
                auVar137._8_4_ = auVar23._8_4_ + fVar104;
                fVar105 = local_2400._12_4_;
                auVar137._12_4_ = auVar23._12_4_ + fVar105;
                fVar106 = local_2400._16_4_;
                auVar137._16_4_ = auVar23._16_4_ + fVar106;
                fVar107 = local_2400._20_4_;
                auVar137._20_4_ = auVar23._20_4_ + fVar107;
                fVar108 = local_2400._24_4_;
                auVar137._24_4_ = auVar23._24_4_ + fVar108;
                fVar109 = local_2400._28_4_;
                auVar137._28_4_ = auVar23._28_4_ + fVar109;
                auVar32._4_4_ = local_2440._4_4_ * auVar112._4_4_;
                auVar32._0_4_ = local_2440._0_4_ * auVar112._0_4_;
                auVar32._8_4_ = local_2440._8_4_ * auVar112._8_4_;
                auVar32._12_4_ = local_2440._12_4_ * auVar112._12_4_;
                auVar32._16_4_ = local_2440._16_4_ * auVar112._16_4_;
                auVar32._20_4_ = local_2440._20_4_ * auVar112._20_4_;
                auVar32._24_4_ = local_2440._24_4_ * auVar112._24_4_;
                auVar32._28_4_ = auVar24._28_4_;
                auVar88 = vfmsub231ps_fma(auVar32,local_2460,auVar137);
                auVar33._4_4_ = local_2420._4_4_ * auVar137._4_4_;
                auVar33._0_4_ = local_2420._0_4_ * auVar137._0_4_;
                auVar33._8_4_ = local_2420._8_4_ * auVar137._8_4_;
                auVar33._12_4_ = local_2420._12_4_ * auVar137._12_4_;
                auVar33._16_4_ = local_2420._16_4_ * auVar137._16_4_;
                auVar33._20_4_ = local_2420._20_4_ * auVar137._20_4_;
                auVar33._24_4_ = local_2420._24_4_ * auVar137._24_4_;
                auVar33._28_4_ = auVar137._28_4_;
                auVar81 = vfmsub231ps_fma(auVar33,local_2440,auVar85);
                auVar34._4_4_ = local_2460._4_4_ * auVar85._4_4_;
                auVar34._0_4_ = local_2460._0_4_ * auVar85._0_4_;
                auVar34._8_4_ = local_2460._8_4_ * auVar85._8_4_;
                auVar34._12_4_ = local_2460._12_4_ * auVar85._12_4_;
                auVar34._16_4_ = local_2460._16_4_ * auVar85._16_4_;
                auVar34._20_4_ = local_2460._20_4_ * auVar85._20_4_;
                auVar34._24_4_ = local_2460._24_4_ * auVar85._24_4_;
                auVar34._28_4_ = auVar85._28_4_;
                auVar98 = vfmsub231ps_fma(auVar34,local_2420,auVar112);
                uVar71 = *(undefined4 *)(ray + k * 4 + 0x50);
                local_28a0._4_4_ = uVar71;
                local_28a0._0_4_ = uVar71;
                local_28a0._8_4_ = uVar71;
                local_28a0._12_4_ = uVar71;
                local_28a0._16_4_ = uVar71;
                local_28a0._20_4_ = uVar71;
                local_28a0._24_4_ = uVar71;
                local_28a0._28_4_ = uVar71;
                local_2940._4_4_ = *(float *)(ray + k * 4 + 0x60);
                auVar35._4_4_ = local_2940._4_4_ * auVar98._4_4_;
                auVar35._0_4_ = local_2940._4_4_ * auVar98._0_4_;
                auVar35._8_4_ = local_2940._4_4_ * auVar98._8_4_;
                auVar35._12_4_ = local_2940._4_4_ * auVar98._12_4_;
                auVar35._16_4_ = local_2940._4_4_ * 0.0;
                auVar35._20_4_ = local_2940._4_4_ * 0.0;
                auVar35._24_4_ = local_2940._4_4_ * 0.0;
                auVar35._28_4_ = auVar112._28_4_;
                auVar81 = vfmadd231ps_fma(auVar35,local_28a0,ZEXT1632(auVar81));
                uVar71 = *(undefined4 *)(ray + k * 4 + 0x40);
                auVar171._4_4_ = uVar71;
                auVar171._0_4_ = uVar71;
                auVar171._8_4_ = uVar71;
                auVar171._12_4_ = uVar71;
                auVar171._16_4_ = uVar71;
                auVar171._20_4_ = uVar71;
                auVar171._24_4_ = uVar71;
                auVar171._28_4_ = uVar71;
                auVar81 = vfmadd231ps_fma(ZEXT1632(auVar81),auVar171,ZEXT1632(auVar88));
                local_2480 = vsubps_avx(local_23e0,auVar100);
                local_24a0 = vsubps_avx(local_2400,auVar124);
                auVar138._0_4_ = local_23e0._0_4_ + auVar100._0_4_;
                auVar138._4_4_ = local_23e0._4_4_ + auVar100._4_4_;
                auVar138._8_4_ = local_23e0._8_4_ + auVar100._8_4_;
                auVar138._12_4_ = local_23e0._12_4_ + auVar100._12_4_;
                auVar138._16_4_ = local_23e0._16_4_ + auVar100._16_4_;
                auVar138._20_4_ = local_23e0._20_4_ + auVar100._20_4_;
                auVar138._24_4_ = local_23e0._24_4_ + auVar100._24_4_;
                fVar159 = auVar100._28_4_;
                auVar138._28_4_ = local_23e0._28_4_ + fVar159;
                auVar142._0_4_ = auVar124._0_4_ + fVar144;
                auVar142._4_4_ = auVar124._4_4_ + fVar97;
                auVar142._8_4_ = auVar124._8_4_ + fVar104;
                auVar142._12_4_ = auVar124._12_4_ + fVar105;
                auVar142._16_4_ = auVar124._16_4_ + fVar106;
                auVar142._20_4_ = auVar124._20_4_ + fVar107;
                auVar142._24_4_ = auVar124._24_4_ + fVar108;
                fVar163 = auVar124._28_4_;
                auVar142._28_4_ = fVar163 + fVar109;
                fVar149 = local_24a0._0_4_;
                fVar153 = local_24a0._4_4_;
                auVar36._4_4_ = fVar153 * auVar138._4_4_;
                auVar36._0_4_ = fVar149 * auVar138._0_4_;
                fVar154 = local_24a0._8_4_;
                auVar36._8_4_ = fVar154 * auVar138._8_4_;
                fVar155 = local_24a0._12_4_;
                auVar36._12_4_ = fVar155 * auVar138._12_4_;
                fVar156 = local_24a0._16_4_;
                auVar36._16_4_ = fVar156 * auVar138._16_4_;
                fVar157 = local_24a0._20_4_;
                auVar36._20_4_ = fVar157 * auVar138._20_4_;
                fVar158 = local_24a0._24_4_;
                auVar36._24_4_ = fVar158 * auVar138._24_4_;
                auVar36._28_4_ = fVar109;
                auVar98 = vfmsub231ps_fma(auVar36,local_2480,auVar142);
                local_24c0 = vsubps_avx(auVar20,auVar83);
                fVar109 = local_24c0._0_4_;
                fVar114 = local_24c0._4_4_;
                auVar37._4_4_ = auVar142._4_4_ * fVar114;
                auVar37._0_4_ = auVar142._0_4_ * fVar109;
                fVar116 = local_24c0._8_4_;
                auVar37._8_4_ = auVar142._8_4_ * fVar116;
                fVar118 = local_24c0._12_4_;
                auVar37._12_4_ = auVar142._12_4_ * fVar118;
                fVar14 = local_24c0._16_4_;
                auVar37._16_4_ = auVar142._16_4_ * fVar14;
                fVar16 = local_24c0._20_4_;
                auVar37._20_4_ = auVar142._20_4_ * fVar16;
                fVar18 = local_24c0._24_4_;
                auVar37._24_4_ = auVar142._24_4_ * fVar18;
                auVar37._28_4_ = fVar163;
                auVar143._0_4_ = auVar20._0_4_ + auVar83._0_4_;
                auVar143._4_4_ = auVar20._4_4_ + auVar83._4_4_;
                auVar143._8_4_ = auVar20._8_4_ + auVar83._8_4_;
                auVar143._12_4_ = auVar20._12_4_ + auVar83._12_4_;
                auVar143._16_4_ = auVar20._16_4_ + auVar83._16_4_;
                auVar143._20_4_ = auVar20._20_4_ + auVar83._20_4_;
                auVar143._24_4_ = auVar20._24_4_ + auVar83._24_4_;
                auVar143._28_4_ = fVar164 + auVar83._28_4_;
                auVar88 = vfmsub231ps_fma(auVar37,local_24a0,auVar143);
                fVar113 = local_2480._0_4_;
                fVar115 = local_2480._4_4_;
                auVar38._4_4_ = auVar143._4_4_ * fVar115;
                auVar38._0_4_ = auVar143._0_4_ * fVar113;
                fVar117 = local_2480._8_4_;
                auVar38._8_4_ = auVar143._8_4_ * fVar117;
                fVar13 = local_2480._12_4_;
                auVar38._12_4_ = auVar143._12_4_ * fVar13;
                fVar15 = local_2480._16_4_;
                auVar38._16_4_ = auVar143._16_4_ * fVar15;
                fVar17 = local_2480._20_4_;
                auVar38._20_4_ = auVar143._20_4_ * fVar17;
                fVar19 = local_2480._24_4_;
                auVar38._24_4_ = auVar143._24_4_ * fVar19;
                auVar38._28_4_ = auVar143._28_4_;
                auVar82 = vfmsub231ps_fma(auVar38,local_24c0,auVar138);
                auVar39._4_4_ = local_2940._4_4_ * auVar82._4_4_;
                auVar39._0_4_ = local_2940._4_4_ * auVar82._0_4_;
                auVar39._8_4_ = local_2940._4_4_ * auVar82._8_4_;
                auVar39._12_4_ = local_2940._4_4_ * auVar82._12_4_;
                auVar39._16_4_ = local_2940._4_4_ * 0.0;
                auVar39._20_4_ = local_2940._4_4_ * 0.0;
                auVar39._24_4_ = local_2940._4_4_ * 0.0;
                auVar39._28_4_ = fVar164;
                auVar88 = vfmadd231ps_fma(auVar39,local_28a0,ZEXT1632(auVar88));
                auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar171,ZEXT1632(auVar98));
                auVar24 = vsubps_avx(auVar83,auVar21);
                auVar128._0_4_ = auVar83._0_4_ + auVar21._0_4_;
                auVar128._4_4_ = auVar83._4_4_ + auVar21._4_4_;
                auVar128._8_4_ = auVar83._8_4_ + auVar21._8_4_;
                auVar128._12_4_ = auVar83._12_4_ + auVar21._12_4_;
                auVar128._16_4_ = auVar83._16_4_ + auVar21._16_4_;
                auVar128._20_4_ = auVar83._20_4_ + auVar21._20_4_;
                auVar128._24_4_ = auVar83._24_4_ + auVar21._24_4_;
                auVar128._28_4_ = auVar83._28_4_ + auVar21._28_4_;
                auVar21 = vsubps_avx(auVar100,auVar22);
                auVar147._0_4_ = auVar22._0_4_ + auVar100._0_4_;
                auVar147._4_4_ = auVar22._4_4_ + auVar100._4_4_;
                auVar147._8_4_ = auVar22._8_4_ + auVar100._8_4_;
                auVar147._12_4_ = auVar22._12_4_ + auVar100._12_4_;
                auVar147._16_4_ = auVar22._16_4_ + auVar100._16_4_;
                auVar147._20_4_ = auVar22._20_4_ + auVar100._20_4_;
                auVar147._24_4_ = auVar22._24_4_ + auVar100._24_4_;
                auVar147._28_4_ = auVar22._28_4_ + fVar159;
                auVar22 = vsubps_avx(auVar124,auVar23);
                auVar94._0_4_ = auVar124._0_4_ + auVar23._0_4_;
                auVar94._4_4_ = auVar124._4_4_ + auVar23._4_4_;
                auVar94._8_4_ = auVar124._8_4_ + auVar23._8_4_;
                auVar94._12_4_ = auVar124._12_4_ + auVar23._12_4_;
                auVar94._16_4_ = auVar124._16_4_ + auVar23._16_4_;
                auVar94._20_4_ = auVar124._20_4_ + auVar23._20_4_;
                auVar94._24_4_ = auVar124._24_4_ + auVar23._24_4_;
                auVar94._28_4_ = fVar163 + auVar23._28_4_;
                auVar40._4_4_ = auVar147._4_4_ * auVar22._4_4_;
                auVar40._0_4_ = auVar147._0_4_ * auVar22._0_4_;
                auVar40._8_4_ = auVar147._8_4_ * auVar22._8_4_;
                auVar40._12_4_ = auVar147._12_4_ * auVar22._12_4_;
                auVar40._16_4_ = auVar147._16_4_ * auVar22._16_4_;
                auVar40._20_4_ = auVar147._20_4_ * auVar22._20_4_;
                auVar40._24_4_ = auVar147._24_4_ * auVar22._24_4_;
                auVar40._28_4_ = fVar159;
                auVar82 = vfmsub231ps_fma(auVar40,auVar21,auVar94);
                auVar41._4_4_ = auVar94._4_4_ * auVar24._4_4_;
                auVar41._0_4_ = auVar94._0_4_ * auVar24._0_4_;
                auVar41._8_4_ = auVar94._8_4_ * auVar24._8_4_;
                auVar41._12_4_ = auVar94._12_4_ * auVar24._12_4_;
                auVar41._16_4_ = auVar94._16_4_ * auVar24._16_4_;
                auVar41._20_4_ = auVar94._20_4_ * auVar24._20_4_;
                auVar41._24_4_ = auVar94._24_4_ * auVar24._24_4_;
                auVar41._28_4_ = auVar94._28_4_;
                auVar98 = vfmsub231ps_fma(auVar41,auVar22,auVar128);
                auVar42._4_4_ = auVar128._4_4_ * auVar21._4_4_;
                auVar42._0_4_ = auVar128._0_4_ * auVar21._0_4_;
                auVar42._8_4_ = auVar128._8_4_ * auVar21._8_4_;
                auVar42._12_4_ = auVar128._12_4_ * auVar21._12_4_;
                auVar42._16_4_ = auVar128._16_4_ * auVar21._16_4_;
                auVar42._20_4_ = auVar128._20_4_ * auVar21._20_4_;
                auVar42._24_4_ = auVar128._24_4_ * auVar21._24_4_;
                auVar42._28_4_ = auVar128._28_4_;
                auVar119 = vfmsub231ps_fma(auVar42,auVar24,auVar147);
                local_2940._0_4_ = local_2940._4_4_;
                uStack_2938._0_4_ = local_2940._4_4_;
                uStack_2938._4_4_ = local_2940._4_4_;
                fStack_2930 = local_2940._4_4_;
                fStack_292c = local_2940._4_4_;
                fStack_2928 = local_2940._4_4_;
                fStack_2924 = local_2940._4_4_;
                auVar23 = _local_2940;
                auVar129._0_4_ = local_2940._4_4_ * auVar119._0_4_;
                auVar129._4_4_ = local_2940._4_4_ * auVar119._4_4_;
                auVar129._8_4_ = local_2940._4_4_ * auVar119._8_4_;
                auVar129._12_4_ = local_2940._4_4_ * auVar119._12_4_;
                auVar129._16_4_ = local_2940._4_4_ * 0.0;
                auVar129._20_4_ = local_2940._4_4_ * 0.0;
                auVar129._24_4_ = local_2940._4_4_ * 0.0;
                auVar129._28_4_ = 0;
                auVar98 = vfmadd231ps_fma(auVar129,local_28a0,ZEXT1632(auVar98));
                auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar171,ZEXT1632(auVar82));
                auVar89._0_4_ = auVar98._0_4_ + auVar88._0_4_ + auVar81._0_4_;
                auVar89._4_4_ = auVar98._4_4_ + auVar88._4_4_ + auVar81._4_4_;
                auVar89._8_4_ = auVar98._8_4_ + auVar88._8_4_ + auVar81._8_4_;
                auVar89._12_4_ = auVar98._12_4_ + auVar88._12_4_ + auVar81._12_4_;
                local_2800 = ZEXT1632(auVar89);
                auVar122._8_4_ = 0x7fffffff;
                auVar122._0_8_ = 0x7fffffff7fffffff;
                auVar122._12_4_ = 0x7fffffff;
                auVar122._16_4_ = 0x7fffffff;
                auVar122._20_4_ = 0x7fffffff;
                auVar122._24_4_ = 0x7fffffff;
                auVar122._28_4_ = 0x7fffffff;
                auVar172 = ZEXT1632(auVar88);
                auVar83 = vminps_avx(ZEXT1632(auVar81),auVar172);
                auVar83 = vminps_avx(auVar83,ZEXT1632(auVar98));
                local_2500 = vandps_avx(local_2800,auVar122);
                fVar159 = local_2500._0_4_ * 1.1920929e-07;
                fVar163 = local_2500._4_4_ * 1.1920929e-07;
                auVar43._4_4_ = fVar163;
                auVar43._0_4_ = fVar159;
                fVar164 = local_2500._8_4_ * 1.1920929e-07;
                auVar43._8_4_ = fVar164;
                fVar165 = local_2500._12_4_ * 1.1920929e-07;
                auVar43._12_4_ = fVar165;
                fVar166 = local_2500._16_4_ * 1.1920929e-07;
                auVar43._16_4_ = fVar166;
                fVar167 = local_2500._20_4_ * 1.1920929e-07;
                auVar43._20_4_ = fVar167;
                fVar168 = local_2500._24_4_ * 1.1920929e-07;
                auVar43._24_4_ = fVar168;
                auVar43._28_4_ = 0x34000000;
                auVar151._0_8_ = CONCAT44(fVar163,fVar159) ^ 0x8000000080000000;
                auVar151._8_4_ = -fVar164;
                auVar151._12_4_ = -fVar165;
                auVar151._16_4_ = -fVar166;
                auVar151._20_4_ = -fVar167;
                auVar151._24_4_ = -fVar168;
                auVar151._28_4_ = 0xb4000000;
                auVar83 = vcmpps_avx(auVar83,auVar151,5);
                local_24e0 = ZEXT1632(auVar81);
                auVar124 = vmaxps_avx(local_24e0,auVar172);
                auVar100 = vmaxps_avx(auVar124,ZEXT1632(auVar98));
                auVar100 = vcmpps_avx(auVar100,auVar43,2);
                auVar100 = vorps_avx(auVar83,auVar100);
                if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar100 >> 0x7f,0) != '\0') ||
                      (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar100 >> 0xbf,0) != '\0') ||
                    (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar100[0x1f] < '\0') {
                  auVar44._4_4_ = local_2440._4_4_ * fVar115;
                  auVar44._0_4_ = local_2440._0_4_ * fVar113;
                  auVar44._8_4_ = local_2440._8_4_ * fVar117;
                  auVar44._12_4_ = local_2440._12_4_ * fVar13;
                  auVar44._16_4_ = local_2440._16_4_ * fVar15;
                  auVar44._20_4_ = local_2440._20_4_ * fVar17;
                  auVar44._24_4_ = local_2440._24_4_ * fVar19;
                  auVar44._28_4_ = auVar83._28_4_;
                  auVar45._4_4_ = fVar114 * local_2460._4_4_;
                  auVar45._0_4_ = fVar109 * local_2460._0_4_;
                  auVar45._8_4_ = fVar116 * local_2460._8_4_;
                  auVar45._12_4_ = fVar118 * local_2460._12_4_;
                  auVar45._16_4_ = fVar14 * local_2460._16_4_;
                  auVar45._20_4_ = fVar16 * local_2460._20_4_;
                  auVar45._24_4_ = fVar18 * local_2460._24_4_;
                  auVar45._28_4_ = auVar124._28_4_;
                  auVar81 = vfmsub213ps_fma(local_2460,local_24a0,auVar44);
                  auVar46._4_4_ = auVar21._4_4_ * fVar153;
                  auVar46._0_4_ = auVar21._0_4_ * fVar149;
                  auVar46._8_4_ = auVar21._8_4_ * fVar154;
                  auVar46._12_4_ = auVar21._12_4_ * fVar155;
                  auVar46._16_4_ = auVar21._16_4_ * fVar156;
                  auVar46._20_4_ = auVar21._20_4_ * fVar157;
                  auVar46._24_4_ = auVar21._24_4_ * fVar158;
                  auVar46._28_4_ = 0x34000000;
                  auVar47._4_4_ = fVar114 * auVar22._4_4_;
                  auVar47._0_4_ = fVar109 * auVar22._0_4_;
                  auVar47._8_4_ = fVar116 * auVar22._8_4_;
                  auVar47._12_4_ = fVar118 * auVar22._12_4_;
                  auVar47._16_4_ = fVar14 * auVar22._16_4_;
                  auVar47._20_4_ = fVar16 * auVar22._20_4_;
                  auVar47._24_4_ = fVar18 * auVar22._24_4_;
                  auVar47._28_4_ = local_2500._28_4_;
                  auVar88 = vfmsub213ps_fma(auVar22,local_2480,auVar46);
                  auVar83 = vandps_avx(auVar44,auVar122);
                  auVar124 = vandps_avx(auVar46,auVar122);
                  auVar83 = vcmpps_avx(auVar83,auVar124,1);
                  auVar22 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar81),auVar83);
                  auVar48._4_4_ = auVar24._4_4_ * fVar115;
                  auVar48._0_4_ = auVar24._0_4_ * fVar113;
                  auVar48._8_4_ = auVar24._8_4_ * fVar117;
                  auVar48._12_4_ = auVar24._12_4_ * fVar13;
                  auVar48._16_4_ = auVar24._16_4_ * fVar15;
                  auVar48._20_4_ = auVar24._20_4_ * fVar17;
                  auVar48._24_4_ = auVar24._24_4_ * fVar19;
                  auVar48._28_4_ = auVar124._28_4_;
                  auVar81 = vfmsub213ps_fma(auVar24,local_24a0,auVar47);
                  auVar49._4_4_ = local_2420._4_4_ * fVar153;
                  auVar49._0_4_ = local_2420._0_4_ * fVar149;
                  auVar49._8_4_ = local_2420._8_4_ * fVar154;
                  auVar49._12_4_ = local_2420._12_4_ * fVar155;
                  auVar49._16_4_ = local_2420._16_4_ * fVar156;
                  auVar49._20_4_ = local_2420._20_4_ * fVar157;
                  auVar49._24_4_ = local_2420._24_4_ * fVar158;
                  auVar49._28_4_ = local_24a0._28_4_;
                  auVar88 = vfmsub213ps_fma(local_2440,local_24c0,auVar49);
                  auVar83 = vandps_avx(auVar49,auVar122);
                  auVar124 = vandps_avx(auVar47,auVar122);
                  auVar83 = vcmpps_avx(auVar83,auVar124,1);
                  auVar24 = vblendvps_avx(ZEXT1632(auVar81),ZEXT1632(auVar88),auVar83);
                  auVar81 = vfmsub213ps_fma(local_2420,local_2480,auVar45);
                  auVar88 = vfmsub213ps_fma(auVar21,local_24c0,auVar48);
                  auVar83 = vandps_avx(auVar45,auVar122);
                  auVar124 = vandps_avx(auVar48,auVar122);
                  auVar83 = vcmpps_avx(auVar83,auVar124,1);
                  auVar83 = vblendvps_avx(ZEXT1632(auVar88),ZEXT1632(auVar81),auVar83);
                  auVar81 = vpackssdw_avx(auVar100._0_16_,auVar100._16_16_);
                  fVar109 = auVar83._0_4_;
                  auVar123._0_4_ = fVar109 * local_2940._4_4_;
                  fVar159 = auVar83._4_4_;
                  auVar123._4_4_ = fVar159 * local_2940._4_4_;
                  fVar113 = auVar83._8_4_;
                  auVar123._8_4_ = fVar113 * local_2940._4_4_;
                  fVar114 = auVar83._12_4_;
                  auVar123._12_4_ = fVar114 * local_2940._4_4_;
                  fVar115 = auVar83._16_4_;
                  auVar123._16_4_ = fVar115 * local_2940._4_4_;
                  fVar116 = auVar83._20_4_;
                  auVar123._20_4_ = fVar116 * local_2940._4_4_;
                  fVar117 = auVar83._24_4_;
                  auVar123._24_4_ = fVar117 * local_2940._4_4_;
                  auVar123._28_4_ = 0;
                  auVar88 = vfmadd213ps_fma(local_28a0,auVar24,auVar123);
                  auVar88 = vfmadd213ps_fma(auVar171,auVar22,ZEXT1632(auVar88));
                  auVar124 = ZEXT1632(CONCAT412(auVar88._12_4_ + auVar88._12_4_,
                                                CONCAT48(auVar88._8_4_ + auVar88._8_4_,
                                                         CONCAT44(auVar88._4_4_ + auVar88._4_4_,
                                                                  auVar88._0_4_ + auVar88._0_4_))));
                  auVar130._0_4_ = fVar109 * fVar144;
                  auVar130._4_4_ = fVar159 * fVar97;
                  auVar130._8_4_ = fVar113 * fVar104;
                  auVar130._12_4_ = fVar114 * fVar105;
                  auVar130._16_4_ = fVar115 * fVar106;
                  auVar130._20_4_ = fVar116 * fVar107;
                  auVar130._24_4_ = fVar117 * fVar108;
                  auVar130._28_4_ = 0;
                  auVar88 = vfmadd213ps_fma(local_23e0,auVar24,auVar130);
                  auVar98 = vfmadd213ps_fma(auVar20,auVar22,ZEXT1632(auVar88));
                  auVar83 = vrcpps_avx(auVar124);
                  auVar161._8_4_ = 0x3f800000;
                  auVar161._0_8_ = &DAT_3f8000003f800000;
                  auVar161._12_4_ = 0x3f800000;
                  auVar161._16_4_ = 0x3f800000;
                  auVar161._20_4_ = 0x3f800000;
                  auVar161._24_4_ = 0x3f800000;
                  auVar161._28_4_ = 0x3f800000;
                  auVar88 = vfnmadd213ps_fma(auVar83,auVar124,auVar161);
                  auVar88 = vfmadd132ps_fma(ZEXT1632(auVar88),auVar83,auVar83);
                  local_28c0 = ZEXT1632(CONCAT412(auVar88._12_4_ * (auVar98._12_4_ + auVar98._12_4_)
                                                  ,CONCAT48(auVar88._8_4_ *
                                                            (auVar98._8_4_ + auVar98._8_4_),
                                                            CONCAT44(auVar88._4_4_ *
                                                                     (auVar98._4_4_ + auVar98._4_4_)
                                                                     ,auVar88._0_4_ *
                                                                      (auVar98._0_4_ + auVar98._0_4_
                                                                      )))));
                  uVar71 = *(undefined4 *)(ray + k * 4 + 0x30);
                  auVar152._4_4_ = uVar71;
                  auVar152._0_4_ = uVar71;
                  auVar152._8_4_ = uVar71;
                  auVar152._12_4_ = uVar71;
                  auVar152._16_4_ = uVar71;
                  auVar152._20_4_ = uVar71;
                  auVar152._24_4_ = uVar71;
                  auVar152._28_4_ = uVar71;
                  auVar83 = vcmpps_avx(auVar152,local_28c0,2);
                  auVar162._4_4_ = fVar148;
                  auVar162._0_4_ = fVar148;
                  auVar162._8_4_ = fVar148;
                  auVar162._12_4_ = fVar148;
                  auVar162._16_4_ = fVar148;
                  auVar162._20_4_ = fVar148;
                  auVar162._24_4_ = fVar148;
                  auVar162._28_4_ = fVar148;
                  auVar100 = vcmpps_avx(local_28c0,auVar162,2);
                  auVar83 = vandps_avx(auVar100,auVar83);
                  auVar88 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
                  auVar81 = vpand_avx(auVar88,auVar81);
                  auVar83 = vpmovsxwd_avx2(auVar81);
                  if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar83 >> 0x7f,0) != '\0') ||
                        (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar83 >> 0xbf,0) != '\0') ||
                      (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar83[0x1f] < '\0') {
                    auVar83 = vcmpps_avx(auVar124,_DAT_02020f00,4);
                    auVar88 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
                    auVar81 = vpand_avx(auVar81,auVar88);
                    local_27c0 = vpmovsxwd_avx2(auVar81);
                    if ((((((((local_27c0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (local_27c0 >> 0x3f & (undefined1  [32])0x1) !=
                                (undefined1  [32])0x0) ||
                            (local_27c0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                           || SUB321(local_27c0 >> 0x7f,0) != '\0') ||
                          (local_27c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(local_27c0 >> 0xbf,0) != '\0') ||
                        (local_27c0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_27c0[0x1f] < '\0') {
                      local_27e0 = &local_2a41;
                      auVar83 = vsubps_avx(local_2800,auVar172);
                      auVar83 = vblendvps_avx(local_24e0,auVar83,local_2520);
                      auVar100 = vsubps_avx(local_2800,local_24e0);
                      auVar100 = vblendvps_avx(auVar172,auVar100,local_2520);
                      local_2760 = local_28c0;
                      local_2740._4_4_ = auVar22._4_4_ * (float)local_2540._4_4_;
                      local_2740._0_4_ = auVar22._0_4_ * (float)local_2540._0_4_;
                      local_2740._8_4_ = auVar22._8_4_ * fStack_2538;
                      local_2740._12_4_ = auVar22._12_4_ * fStack_2534;
                      local_2740._16_4_ = auVar22._16_4_ * fStack_2530;
                      local_2740._20_4_ = auVar22._20_4_ * fStack_252c;
                      local_2740._24_4_ = auVar22._24_4_ * fStack_2528;
                      local_2740._28_4_ = 0;
                      local_2720[0] = (float)local_2540._0_4_ * auVar24._0_4_;
                      local_2720[1] = (float)local_2540._4_4_ * auVar24._4_4_;
                      local_2720[2] = fStack_2538 * auVar24._8_4_;
                      local_2720[3] = fStack_2534 * auVar24._12_4_;
                      fStack_2710 = fStack_2530 * auVar24._16_4_;
                      fStack_270c = fStack_252c * auVar24._20_4_;
                      fStack_2708 = fStack_2528 * auVar24._24_4_;
                      uStack_2704 = auVar24._28_4_;
                      local_2700[0] = (float)local_2540._0_4_ * fVar109;
                      local_2700[1] = (float)local_2540._4_4_ * fVar159;
                      local_2700[2] = fStack_2538 * fVar113;
                      local_2700[3] = fStack_2534 * fVar114;
                      fStack_26f0 = fStack_2530 * fVar115;
                      fStack_26ec = fStack_252c * fVar116;
                      fStack_26e8 = fStack_2528 * fVar117;
                      uStack_26e4 = auVar24._28_4_;
                      auVar86._0_8_ = (ulong)CONCAT24(uVar8,(uint)uVar8) & 0x7fff00007fff;
                      auVar86._8_4_ = local_2a3c;
                      auVar86._12_4_ = local_2a3c;
                      auVar86._16_4_ = local_2a3c;
                      auVar86._20_4_ = local_2a3c;
                      auVar86._24_4_ = local_2a3c;
                      auVar86._28_4_ = local_2a3c;
                      auVar124 = vpaddd_avx2(auVar86,_DAT_0205d4c0);
                      auVar103._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                      auVar103._8_4_ = local_2a40;
                      auVar103._12_4_ = local_2a40;
                      auVar103._16_4_ = local_2a40;
                      auVar103._20_4_ = local_2a40;
                      auVar103._24_4_ = local_2a40;
                      auVar103._28_4_ = local_2a40;
                      auVar20 = vpaddd_avx2(auVar103,_DAT_0205d4e0);
                      auVar99._0_4_ = (float)(int)(*(ushort *)(local_2988 + 8 + lVar78) - 1);
                      auVar99._4_12_ = auVar89._4_12_;
                      auVar81 = vrcpss_avx(auVar99,auVar99);
                      auVar88 = vfnmadd213ss_fma(auVar99,auVar81,SUB6416(ZEXT464(0x40000000),0));
                      fVar148 = auVar81._0_4_ * auVar88._0_4_;
                      auVar134._0_4_ = (float)(int)(*(ushort *)(local_2988 + 10 + lVar78) - 1);
                      auVar134._4_12_ = auVar89._4_12_;
                      auVar81 = vrcpss_avx(auVar134,auVar134);
                      auVar88 = vfnmadd213ss_fma(auVar134,auVar81,SUB6416(ZEXT464(0x40000000),0));
                      fVar144 = auVar81._0_4_ * auVar88._0_4_;
                      auVar124 = vcvtdq2ps_avx(auVar124);
                      fVar97 = (auVar89._0_4_ * auVar124._0_4_ + auVar83._0_4_) * fVar148;
                      fVar104 = (auVar89._4_4_ * auVar124._4_4_ + auVar83._4_4_) * fVar148;
                      local_2840._4_4_ = fVar104;
                      local_2840._0_4_ = fVar97;
                      fVar105 = (auVar89._8_4_ * auVar124._8_4_ + auVar83._8_4_) * fVar148;
                      local_2840._8_4_ = fVar105;
                      fVar106 = (auVar89._12_4_ * auVar124._12_4_ + auVar83._12_4_) * fVar148;
                      local_2840._12_4_ = fVar106;
                      fVar107 = (auVar124._16_4_ * 0.0 + auVar83._16_4_) * fVar148;
                      local_2840._16_4_ = fVar107;
                      fVar108 = (auVar124._20_4_ * 0.0 + auVar83._20_4_) * fVar148;
                      local_2840._20_4_ = fVar108;
                      fVar109 = (auVar124._24_4_ * 0.0 + auVar83._24_4_) * fVar148;
                      local_2840._24_4_ = fVar109;
                      local_2840._28_4_ = fVar148;
                      auVar83 = vcvtdq2ps_avx(auVar20);
                      fVar159 = (auVar89._0_4_ * auVar83._0_4_ + auVar100._0_4_) * fVar144;
                      fVar113 = (auVar89._4_4_ * auVar83._4_4_ + auVar100._4_4_) * fVar144;
                      local_2820._4_4_ = fVar113;
                      local_2820._0_4_ = fVar159;
                      fVar114 = (auVar89._8_4_ * auVar83._8_4_ + auVar100._8_4_) * fVar144;
                      local_2820._8_4_ = fVar114;
                      fVar115 = (auVar89._12_4_ * auVar83._12_4_ + auVar100._12_4_) * fVar144;
                      local_2820._12_4_ = fVar115;
                      fVar116 = (auVar83._16_4_ * 0.0 + auVar100._16_4_) * fVar144;
                      local_2820._16_4_ = fVar116;
                      fVar117 = (auVar83._20_4_ * 0.0 + auVar100._20_4_) * fVar144;
                      local_2820._20_4_ = fVar117;
                      fVar118 = (auVar83._24_4_ * 0.0 + auVar100._24_4_) * fVar144;
                      local_2820._24_4_ = fVar118;
                      local_2820._28_4_ = fVar144;
                      pGVar11 = (local_2980->geometries).items[(uint)local_2920._4_4_].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar132 = ZEXT3264(local_28c0);
                        auVar83 = vrcpps_avx(local_2800);
                        auVar131._8_4_ = 0x3f800000;
                        auVar131._0_8_ = &DAT_3f8000003f800000;
                        auVar131._12_4_ = 0x3f800000;
                        auVar131._16_4_ = 0x3f800000;
                        auVar131._20_4_ = 0x3f800000;
                        auVar131._24_4_ = 0x3f800000;
                        auVar131._28_4_ = 0x3f800000;
                        auVar81 = vfnmadd213ps_fma(local_2800,auVar83,auVar131);
                        auVar81 = vfmadd132ps_fma(ZEXT1632(auVar81),auVar83,auVar83);
                        auVar125._8_4_ = 0x219392ef;
                        auVar125._0_8_ = 0x219392ef219392ef;
                        auVar125._12_4_ = 0x219392ef;
                        auVar125._16_4_ = 0x219392ef;
                        auVar125._20_4_ = 0x219392ef;
                        auVar125._24_4_ = 0x219392ef;
                        auVar125._28_4_ = 0x219392ef;
                        auVar83 = vcmpps_avx(local_2500,auVar125,5);
                        auVar83 = vandps_avx(auVar83,ZEXT1632(auVar81));
                        auVar50._4_4_ = fVar104 * auVar83._4_4_;
                        auVar50._0_4_ = fVar97 * auVar83._0_4_;
                        auVar50._8_4_ = fVar105 * auVar83._8_4_;
                        auVar50._12_4_ = fVar106 * auVar83._12_4_;
                        auVar50._16_4_ = fVar107 * auVar83._16_4_;
                        auVar50._20_4_ = fVar108 * auVar83._20_4_;
                        auVar50._24_4_ = fVar109 * auVar83._24_4_;
                        auVar50._28_4_ = fVar148;
                        local_27a0 = vminps_avx(auVar50,auVar131);
                        auVar51._4_4_ = fVar113 * auVar83._4_4_;
                        auVar51._0_4_ = fVar159 * auVar83._0_4_;
                        auVar51._8_4_ = fVar114 * auVar83._8_4_;
                        auVar51._12_4_ = fVar115 * auVar83._12_4_;
                        auVar51._16_4_ = fVar116 * auVar83._16_4_;
                        auVar51._20_4_ = fVar117 * auVar83._20_4_;
                        auVar51._24_4_ = fVar118 * auVar83._24_4_;
                        auVar51._28_4_ = auVar83._28_4_;
                        local_2780 = vminps_avx(auVar51,auVar131);
                        auVar95._8_4_ = 0x7f800000;
                        auVar95._0_8_ = 0x7f8000007f800000;
                        auVar95._12_4_ = 0x7f800000;
                        auVar95._16_4_ = 0x7f800000;
                        auVar95._20_4_ = 0x7f800000;
                        auVar95._24_4_ = 0x7f800000;
                        auVar95._28_4_ = 0x7f800000;
                        auVar83 = vblendvps_avx(auVar95,local_28c0,local_27c0);
                        auVar100 = vshufps_avx(auVar83,auVar83,0xb1);
                        auVar100 = vminps_avx(auVar83,auVar100);
                        auVar124 = vshufpd_avx(auVar100,auVar100,5);
                        auVar100 = vminps_avx(auVar100,auVar124);
                        auVar124 = vpermpd_avx2(auVar100,0x4e);
                        auVar100 = vminps_avx(auVar100,auVar124);
                        auVar100 = vcmpps_avx(auVar83,auVar100,0);
                        auVar124 = local_27c0 & auVar100;
                        auVar83 = local_27c0;
                        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar124 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar124 >> 0x7f,0) != '\0')
                              || (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar124 >> 0xbf,0) != '\0') ||
                            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar124[0x1f] < '\0') {
                          auVar83 = vandps_avx(auVar100,local_27c0);
                        }
                        uVar68 = vmovmskps_avx(auVar83);
                        uVar73 = 0;
                        for (; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x80000000) {
                          uVar73 = uVar73 + 1;
                        }
                        uVar76 = (ulong)uVar73;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          uVar71 = *(undefined4 *)(local_27a0 + uVar76 * 4);
                          uVar1 = *(undefined4 *)(local_2780 + uVar76 * 4);
                          fVar148 = local_2720[uVar76 - 8];
                          fVar144 = local_2720[uVar76];
                          fVar97 = local_2700[uVar76];
                          *(undefined4 *)(ray + k * 4 + 0x80) =
                               *(undefined4 *)(local_2760 + uVar76 * 4);
                          *(float *)(ray + k * 4 + 0xc0) = fVar148;
                          *(float *)(ray + k * 4 + 0xd0) = fVar144;
                          *(float *)(ray + k * 4 + 0xe0) = fVar97;
                          *(undefined4 *)(ray + k * 4 + 0xf0) = uVar71;
                          *(undefined4 *)(ray + k * 4 + 0x100) = uVar1;
                          *(uint *)(ray + k * 4 + 0x110) = uVar10;
                          *(undefined4 *)(ray + k * 4 + 0x120) = local_2920._4_4_;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_2920._0_4_ = local_2920._4_4_;
                          local_2920._8_4_ = local_2920._4_4_;
                          auStack_2910 = auVar171._16_16_;
                          local_2920._12_4_ = local_2920._4_4_;
                          local_2940._4_4_ = (float)uVar10;
                          local_2940._0_4_ = uVar10;
                          uStack_2938._0_4_ = uVar10;
                          _fStack_2930 = auVar23._16_16_;
                          uStack_2938._4_4_ = uVar10;
                          local_2a30 = *local_2a10;
                          uStack_2a28 = local_2a10[1];
                          local_2860 = local_27c0;
                          do {
                            local_28a0._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                            uVar71 = *(undefined4 *)(local_27a0 + uVar76 * 4);
                            auVar90._4_4_ = uVar71;
                            auVar90._0_4_ = uVar71;
                            auVar90._8_4_ = uVar71;
                            auVar90._12_4_ = uVar71;
                            local_25b0 = *(undefined4 *)(local_2780 + uVar76 * 4);
                            *(undefined4 *)(ray + k * 4 + 0x80) =
                                 *(undefined4 *)(local_2760 + uVar76 * 4);
                            local_2970.context = context->user;
                            local_25f0 = local_2720[uVar76 - 8];
                            fVar148 = local_2720[uVar76];
                            auVar110._4_4_ = fVar148;
                            auVar110._0_4_ = fVar148;
                            auVar110._8_4_ = fVar148;
                            auVar110._12_4_ = fVar148;
                            fVar148 = local_2700[uVar76];
                            local_25d0._4_4_ = fVar148;
                            local_25d0._0_4_ = fVar148;
                            local_25d0._8_4_ = fVar148;
                            local_25d0._12_4_ = fVar148;
                            fStack_25ec = local_25f0;
                            fStack_25e8 = local_25f0;
                            fStack_25e4 = local_25f0;
                            local_25e0 = auVar110;
                            local_25c0 = auVar90;
                            uStack_25ac = local_25b0;
                            uStack_25a8 = local_25b0;
                            uStack_25a4 = local_25b0;
                            local_25a0 = local_2940;
                            uStack_2598 = uStack_2938;
                            local_2590 = local_2920;
                            vpcmpeqd_avx2(ZEXT1632(local_2920),ZEXT1632(local_2920));
                            uStack_257c = (local_2970.context)->instID[0];
                            local_2580 = uStack_257c;
                            uStack_2578 = uStack_257c;
                            uStack_2574 = uStack_257c;
                            uStack_2570 = (local_2970.context)->instPrimID[0];
                            uStack_256c = uStack_2570;
                            uStack_2568 = uStack_2570;
                            uStack_2564 = uStack_2570;
                            local_2a20 = local_2a30;
                            uStack_2a18 = uStack_2a28;
                            local_2970.valid = (int *)&local_2a20;
                            local_2970.geometryUserPtr = pGVar11->userPtr;
                            local_2970.hit = (RTCHitN *)&local_25f0;
                            local_2970.N = 4;
                            local_2970.ray = (RTCRayN *)ray;
                            if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                              (*pGVar11->intersectionFilterN)(&local_2970);
                              auVar132._8_56_ = extraout_var;
                              auVar132._0_8_ = extraout_XMM1_Qa;
                              auVar90 = auVar132._0_16_;
                              auVar132 = ZEXT3264(local_28c0);
                            }
                            auVar60._8_8_ = uStack_2a18;
                            auVar60._0_8_ = local_2a20;
                            if (auVar60 == (undefined1  [16])0x0) {
                              auVar81 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                              auVar88 = vpcmpeqd_avx(auVar90,auVar90);
                              auVar81 = auVar81 ^ auVar88;
                            }
                            else {
                              p_Var12 = context->args->filter;
                              auVar88 = vpcmpeqd_avx(auVar110,auVar110);
                              if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                                 (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER
                                   ) != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                  (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                                (*p_Var12)(&local_2970);
                                auVar132 = ZEXT3264(local_28c0);
                                auVar88 = vpcmpeqd_avx(auVar88,auVar88);
                              }
                              auVar61._8_8_ = uStack_2a18;
                              auVar61._0_8_ = local_2a20;
                              auVar98 = vpcmpeqd_avx(auVar61,_DAT_01feba10);
                              auVar81 = auVar98 ^ auVar88;
                              if (auVar61 != (undefined1  [16])0x0) {
                                auVar98 = auVar98 ^ auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  local_2970.hit);
                                *(undefined1 (*) [16])(local_2970.ray + 0xc0) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x10));
                                *(undefined1 (*) [16])(local_2970.ray + 0xd0) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x20));
                                *(undefined1 (*) [16])(local_2970.ray + 0xe0) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x30));
                                *(undefined1 (*) [16])(local_2970.ray + 0xf0) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x40));
                                *(undefined1 (*) [16])(local_2970.ray + 0x100) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x50));
                                *(undefined1 (*) [16])(local_2970.ray + 0x110) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x60));
                                *(undefined1 (*) [16])(local_2970.ray + 0x120) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x70));
                                *(undefined1 (*) [16])(local_2970.ray + 0x130) = auVar88;
                                auVar88 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])
                                                                  (local_2970.hit + 0x80));
                                *(undefined1 (*) [16])(local_2970.ray + 0x140) = auVar88;
                              }
                            }
                            auVar91._8_8_ = 0x100000001;
                            auVar91._0_8_ = 0x100000001;
                            if ((auVar91 & auVar81) == (undefined1  [16])0x0) {
                              *(undefined4 *)(ray + k * 4 + 0x80) = local_28a0._0_4_;
                            }
                            *(undefined4 *)(local_2860 + uVar76 * 4) = 0;
                            uVar71 = *(undefined4 *)(ray + k * 4 + 0x80);
                            auVar87._4_4_ = uVar71;
                            auVar87._0_4_ = uVar71;
                            auVar87._8_4_ = uVar71;
                            auVar87._12_4_ = uVar71;
                            auVar87._16_4_ = uVar71;
                            auVar87._20_4_ = uVar71;
                            auVar87._24_4_ = uVar71;
                            auVar87._28_4_ = uVar71;
                            auVar100 = vcmpps_avx(auVar132._0_32_,auVar87,2);
                            auVar83 = vandps_avx(auVar100,local_2860);
                            local_2860 = local_2860 & auVar100;
                            bVar58 = (local_2860 >> 0x1f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar59 = (local_2860 >> 0x3f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar57 = (local_2860 >> 0x5f & (undefined1  [32])0x1) !=
                                     (undefined1  [32])0x0;
                            bVar56 = SUB321(local_2860 >> 0x7f,0) != '\0';
                            bVar55 = (local_2860 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar54 = SUB321(local_2860 >> 0xbf,0) != '\0';
                            bVar53 = (local_2860 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0;
                            bVar52 = local_2860[0x1f] < '\0';
                            if (((((((bVar58 || bVar59) || bVar57) || bVar56) || bVar55) || bVar54)
                                || bVar53) || bVar52) {
                              auVar96._8_4_ = 0x7f800000;
                              auVar96._0_8_ = 0x7f8000007f800000;
                              auVar96._12_4_ = 0x7f800000;
                              auVar96._16_4_ = 0x7f800000;
                              auVar96._20_4_ = 0x7f800000;
                              auVar96._24_4_ = 0x7f800000;
                              auVar96._28_4_ = 0x7f800000;
                              auVar100 = vblendvps_avx(auVar96,auVar132._0_32_,auVar83);
                              auVar124 = vshufps_avx(auVar100,auVar100,0xb1);
                              auVar124 = vminps_avx(auVar100,auVar124);
                              auVar20 = vshufpd_avx(auVar124,auVar124,5);
                              auVar124 = vminps_avx(auVar124,auVar20);
                              auVar20 = vpermpd_avx2(auVar124,0x4e);
                              auVar124 = vminps_avx(auVar124,auVar20);
                              auVar124 = vcmpps_avx(auVar100,auVar124,0);
                              auVar20 = auVar83 & auVar124;
                              auVar100 = auVar83;
                              if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) !=
                                        (undefined1  [32])0x0 ||
                                       (auVar20 >> 0x3f & (undefined1  [32])0x1) !=
                                       (undefined1  [32])0x0) ||
                                      (auVar20 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar20 >> 0x7f,0) != '\0')
                                    || (auVar20 & (undefined1  [32])0x100000000) !=
                                       (undefined1  [32])0x0) || SUB321(auVar20 >> 0xbf,0) != '\0')
                                  || (auVar20 & (undefined1  [32])0x100000000) !=
                                     (undefined1  [32])0x0) || auVar20[0x1f] < '\0') {
                                auVar100 = vandps_avx(auVar124,auVar83);
                              }
                              uVar73 = vmovmskps_avx(auVar100);
                              uVar10 = 0;
                              for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
                                uVar10 = uVar10 + 1;
                              }
                              uVar76 = (ulong)uVar10;
                            }
                            local_2860 = auVar83;
                          } while (((((((bVar58 || bVar59) || bVar57) || bVar56) || bVar55) ||
                                    bVar54) || bVar53) || bVar52);
                        }
                      }
                    }
                  }
                }
              }
              local_2978 = local_2978 - 1 & local_2978;
            } while (local_2978 != 0);
          }
          local_2998 = local_2998 + 1;
          fVar144 = local_2560;
          fVar97 = fStack_255c;
          fVar104 = fStack_2558;
          fVar105 = fStack_2554;
          fVar106 = fStack_2550;
          fVar107 = fStack_254c;
          fVar148 = fStack_2548;
        } while (local_2998 != local_29d0);
      }
      iStack_2864 = *(int *)(ray + k * 4 + 0x80);
      auVar132 = ZEXT3264(local_28e0);
      auVar139 = ZEXT3264(local_2900);
      iStack_2868 = iStack_2864;
      iStack_286c = iStack_2864;
      iStack_2870 = iStack_2864;
      iStack_2874 = iStack_2864;
      iStack_2878 = iStack_2864;
      iStack_287c = iStack_2864;
      local_2880 = iStack_2864;
      fVar108 = fStack_26c8;
      fVar109 = fStack_26cc;
      fVar159 = fStack_26d0;
      fVar113 = fStack_26d4;
      fVar114 = fStack_26d8;
      fVar115 = fStack_26dc;
      fVar116 = local_26e0;
    }
  } while( true );
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect1(Accel::Intersectors* This,
                                                                                                const BVH* bvh,
                                                                                                NodeRef root,
                                                                                                size_t k,
                                                                                                Precalculations& pre,
                                                                                                RayHitK<K>& ray,
                                                                                                const TravRayK<K, robust>& tray,
                                                                                                RayQueryContext* context)
    {
      /* stack state */
      StackItemT<NodeRef> stack[stackSizeSingle];  // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack + 1;   // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack + stackSizeSingle;
      stack[0].ptr = root;
      stack[0].dist = neg_inf;

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray1;
      tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar[k]))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes, 1, 1, 1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          BVHNNodeTraverser1Hit<N, types>::traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves, 1, 1, 1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

        size_t lazy_node = 0;
        PrimitiveIntersectorK::intersect(This, pre, ray, k, context, prim, num, tray1, lazy_node);

        tray1.tfar = ray.tfar[k];

        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }